

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifr.c
# Opt level: O1

int igsc_device_update_late_binding_config
              (igsc_device_handle *handle,uint32_t type,uint32_t flags,uint8_t *payload,
              size_t payload_size,uint32_t *cmd_status)

{
  mkhi_msg_hdr *__dest;
  size_t req_sz;
  igsc_lib_ctx *lib_ctx;
  size_t buf_size;
  mkhi_msg_hdr *resp_header;
  bool bVar1;
  uint uVar2;
  int iVar3;
  igsc_log_func_t p_Var4;
  char *pcVar5;
  char *pcVar6;
  undefined8 uVar7;
  long in_FS_OFFSET;
  size_t received_len;
  char __time_buf [128];
  undefined8 in_stack_fffffffffffffef8;
  undefined4 uVar9;
  undefined8 uVar8;
  size_t local_c0;
  char local_b8 [128];
  long local_38;
  
  uVar9 = (undefined4)((ulong)in_stack_fffffffffffffef8 >> 0x20);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_c0 = 0;
  iVar3 = 3;
  if ((((handle == (igsc_device_handle *)0x0) || (payload_size == 0)) || (payload == (uint8_t *)0x0)
      ) || ((cmd_status == (uint32_t *)0x0 ||
            (lib_ctx = handle->ctx, lib_ctx == (igsc_lib_ctx *)0x0)))) goto LAB_00115dfa;
  if (type - 3 < 0xfffffffe) {
    p_Var4 = igsc_get_log_callback_func();
    if (p_Var4 == (igsc_log_func_t)0x0) {
      pcVar5 = gsc_time(local_b8,0x80);
      uVar8 = CONCAT44(uVar9,type);
      pcVar6 = "%s: IGSC: (%s:%s():%d) Wrong payload type %u\n";
      iVar3 = 3;
      uVar7 = 0x691;
LAB_00115bf1:
      syslog(3,pcVar6,pcVar5,
             "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
             "igsc_device_update_late_binding_config",uVar7,uVar8);
      goto LAB_00115dfa;
    }
    p_Var4 = igsc_get_log_callback_func();
    pcVar5 = gsc_time(local_b8,0x80);
    uVar8 = CONCAT44(uVar9,type);
    pcVar6 = "%s: IGSC: (%s:%s():%d) Wrong payload type %u\n";
    uVar7 = 0x691;
  }
  else if (flags < 2) {
    uVar2 = igsc_get_log_level();
    if (uVar2 != 0) {
      p_Var4 = igsc_get_log_callback_func();
      if (p_Var4 == (igsc_log_func_t)0x0) {
        pcVar5 = gsc_time(local_b8,0x80);
        syslog(7,"%s: IGSC: (%s:%s():%d) in late binding, initializing driver\n",pcVar5,
               "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
               "igsc_device_update_late_binding_config",0x69b);
      }
      else {
        p_Var4 = igsc_get_log_callback_func();
        pcVar5 = gsc_time(local_b8,0x80);
        (*p_Var4)(IGSC_LOG_LEVEL_DEBUG,
                  "%s: IGSC: (%s:%s():%d) in late binding, initializing driver\n",pcVar5,
                  "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
                  "igsc_device_update_late_binding_config",0x69b);
      }
    }
    iVar3 = gsc_driver_init(lib_ctx,&GUID_METEE_MKHI);
    if (iVar3 == 0) {
      buf_size = lib_ctx->working_buffer_length;
      if (buf_size - 0x18 < payload_size) {
        p_Var4 = igsc_get_log_callback_func();
        if (p_Var4 == (igsc_log_func_t)0x0) {
          pcVar5 = gsc_time(local_b8,0x80);
          pcVar6 = "%s: IGSC: (%s:%s():%d) Payload size is too big %zu\n";
          iVar3 = 3;
          uVar7 = 0x6a8;
          goto LAB_00115d5f;
        }
        p_Var4 = igsc_get_log_callback_func();
        pcVar5 = gsc_time(local_b8,0x80);
        (*p_Var4)(IGSC_LOG_LEVEL_ERROR,"%s: IGSC: (%s:%s():%d) Payload size is too big %zu\n",pcVar5
                  ,"/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
                  "igsc_device_update_late_binding_config",0x6a8,payload_size);
        iVar3 = 3;
      }
      else {
        resp_header = (mkhi_msg_hdr *)lib_ctx->working_buffer;
        req_sz = payload_size + 0x18;
        iVar3 = gsc_fwu_buffer_validate(lib_ctx,req_sz,0x14);
        if (iVar3 == 0) {
          memset(resp_header,0,req_sz);
          resp_header->field_0x1 = resp_header->field_0x1 & 0x80 | 0x12;
          resp_header->group_id = '0';
          resp_header[1].group_id = (char)type;
          resp_header[1].field_0x1 = (char)(type >> 8);
          resp_header[1].reserved = (char)(type >> 0x10);
          resp_header[1].result = (char)(type >> 0x18);
          resp_header[2].group_id = (char)flags;
          resp_header[2].field_0x1 = (char)(flags >> 8);
          resp_header[2].reserved = (char)(flags >> 0x10);
          resp_header[2].result = (char)(flags >> 0x18);
          resp_header[5] = SUB84(payload_size,0);
          if (-1 < (long)(buf_size - 0x18)) {
            __dest = resp_header + 6;
            bVar1 = &resp_header->group_id + buf_size <= payload;
            if (payload < __dest) {
              bVar1 = (mkhi_msg_hdr *)(payload + (payload_size - 1)) < __dest;
            }
            if (bVar1) {
              memcpy(__dest,payload,payload_size);
              iVar3 = gsc_tee_command(lib_ctx,resp_header,req_sz,resp_header,buf_size,&local_c0);
              if (iVar3 != 0) {
                p_Var4 = igsc_get_log_callback_func();
                if (p_Var4 != (igsc_log_func_t)0x0) {
                  p_Var4 = igsc_get_log_callback_func();
                  pcVar5 = gsc_time(local_b8,0x80);
                  uVar8 = CONCAT44(uVar9,iVar3);
                  uVar7 = 0x6c7;
LAB_00115d1b:
                  (*p_Var4)(IGSC_LOG_LEVEL_ERROR,
                            "%s: IGSC: (%s:%s():%d) Invalid HECI message response (%d)\n",pcVar5,
                            "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c"
                            ,"igsc_device_update_late_binding_config",uVar7,uVar8);
                  goto LAB_00115df0;
                }
                pcVar5 = gsc_time(local_b8,0x80);
                payload_size = CONCAT44(uVar9,iVar3);
                pcVar6 = "%s: IGSC: (%s:%s():%d) Invalid HECI message response (%d)\n";
                uVar7 = 0x6c7;
LAB_00115d5f:
                syslog(3,pcVar6,pcVar5,
                       "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
                       "igsc_device_update_late_binding_config",uVar7,payload_size);
                goto LAB_00115df0;
              }
              if (local_c0 < 0x14) {
                p_Var4 = igsc_get_log_callback_func();
                if (p_Var4 == (igsc_log_func_t)0x0) {
                  pcVar5 = gsc_time(local_b8,0x80);
                  pcVar6 = "%s: IGSC: (%s:%s():%d) Error in HECI read - bad size %zu\n";
                  uVar7 = 0x6cd;
                  goto LAB_00115f66;
                }
                p_Var4 = igsc_get_log_callback_func();
                pcVar5 = gsc_time(local_b8,0x80);
                pcVar6 = "%s: IGSC: (%s:%s():%d) Error in HECI read - bad size %zu\n";
                uVar7 = 0x6cd;
                goto LAB_00115e7f;
              }
              iVar3 = mkhi_heci_validate_response_header(lib_ctx,resp_header,0x12);
              if (iVar3 != 0) {
                p_Var4 = igsc_get_log_callback_func();
                if (p_Var4 != (igsc_log_func_t)0x0) {
                  p_Var4 = igsc_get_log_callback_func();
                  pcVar5 = gsc_time(local_b8,0x80);
                  uVar8 = CONCAT44(uVar9,iVar3);
                  uVar7 = 0x6d6;
                  goto LAB_00115d1b;
                }
                pcVar5 = gsc_time(local_b8,0x80);
                payload_size = CONCAT44(uVar9,iVar3);
                pcVar6 = "%s: IGSC: (%s:%s():%d) Invalid HECI message response (%d)\n";
                uVar7 = 0x6d6;
                goto LAB_00115d5f;
              }
              if (local_c0 == 0x14) {
                if (resp_header[1] == (mkhi_msg_hdr)type) {
                  if ((resp_header[2] == (mkhi_msg_hdr)0x0) && (resp_header[3] == (mkhi_msg_hdr)0x0)
                     ) {
                    uVar2 = igsc_get_log_level();
                    if (uVar2 != 0) {
                      p_Var4 = igsc_get_log_callback_func();
                      if (p_Var4 == (igsc_log_func_t)0x0) {
                        pcVar5 = gsc_time(local_b8,0x80);
                        syslog(7,"%s: IGSC: (%s:%s():%d) success, status %u\n",pcVar5,
                               "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c"
                               ,"igsc_device_update_late_binding_config",0x6f0,
                               CONCAT44(uVar9,resp_header[4]));
                      }
                      else {
                        p_Var4 = igsc_get_log_callback_func();
                        pcVar5 = gsc_time(local_b8,0x80);
                        (*p_Var4)(IGSC_LOG_LEVEL_DEBUG,"%s: IGSC: (%s:%s():%d) success, status %u\n"
                                  ,pcVar5,
                                  "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c"
                                  ,"igsc_device_update_late_binding_config",0x6f0,
                                  CONCAT44(uVar9,resp_header[4]));
                      }
                    }
                    *cmd_status = (uint32_t)resp_header[4];
                    iVar3 = 0;
                    goto LAB_00115df0;
                  }
                  p_Var4 = igsc_get_log_callback_func();
                  if (p_Var4 == (igsc_log_func_t)0x0) {
                    pcVar5 = gsc_time(local_b8,0x80);
                    pcVar6 = "%s: IGSC: (%s:%s():%d) HECI message response is leaking data\n";
                    uVar7 = 0x6eb;
                    goto LAB_00115f66;
                  }
                  p_Var4 = igsc_get_log_callback_func();
                  pcVar5 = gsc_time(local_b8,0x80);
                  pcVar6 = "%s: IGSC: (%s:%s():%d) HECI message response is leaking data\n";
                  uVar7 = 0x6eb;
                }
                else {
                  p_Var4 = igsc_get_log_callback_func();
                  if (p_Var4 == (igsc_log_func_t)0x0) {
                    pcVar5 = gsc_time(local_b8,0x80);
                    pcVar6 = 
                    "%s: IGSC: (%s:%s():%d) Received wrong payload type in response from firmware %u, expected %u\n"
                    ;
                    uVar7 = 0x6e4;
                    goto LAB_00115f66;
                  }
                  p_Var4 = igsc_get_log_callback_func();
                  pcVar5 = gsc_time(local_b8,0x80);
                  pcVar6 = 
                  "%s: IGSC: (%s:%s():%d) Received wrong payload type in response from firmware %u, expected %u\n"
                  ;
                  uVar7 = 0x6e4;
                }
LAB_00115e7f:
                (*p_Var4)(IGSC_LOG_LEVEL_ERROR,pcVar6,pcVar5,
                          "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c"
                          ,"igsc_device_update_late_binding_config",uVar7);
              }
              else {
                p_Var4 = igsc_get_log_callback_func();
                if (p_Var4 != (igsc_log_func_t)0x0) {
                  p_Var4 = igsc_get_log_callback_func();
                  pcVar5 = gsc_time(local_b8,0x80);
                  pcVar6 = "%s: IGSC: (%s:%s():%d) Error in HECI read - bad size %zu\n";
                  uVar7 = 0x6dc;
                  goto LAB_00115e7f;
                }
                pcVar5 = gsc_time(local_b8,0x80);
                pcVar6 = "%s: IGSC: (%s:%s():%d) Error in HECI read - bad size %zu\n";
                uVar7 = 0x6dc;
LAB_00115f66:
                syslog(3,pcVar6,pcVar5,
                       "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
                       "igsc_device_update_late_binding_config",uVar7);
              }
              iVar3 = 6;
              goto LAB_00115df0;
            }
          }
          p_Var4 = igsc_get_log_callback_func();
          if (p_Var4 == (igsc_log_func_t)0x0) {
            pcVar5 = gsc_time(local_b8,0x80);
            syslog(3,"%s: IGSC: (%s:%s():%d) Copy of payload data failed\n",pcVar5,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
                   "igsc_device_update_late_binding_config",0x6bf);
          }
          else {
            p_Var4 = igsc_get_log_callback_func();
            pcVar5 = gsc_time(local_b8,0x80);
            (*p_Var4)(IGSC_LOG_LEVEL_ERROR,"%s: IGSC: (%s:%s():%d) Copy of payload data failed\n",
                      pcVar5,
                      "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
                      "igsc_device_update_late_binding_config",0x6bf);
          }
          iVar3 = 1;
        }
      }
LAB_00115df0:
      gsc_driver_deinit(lib_ctx);
      goto LAB_00115dfa;
    }
    p_Var4 = igsc_get_log_callback_func();
    if (p_Var4 == (igsc_log_func_t)0x0) {
      pcVar5 = gsc_time(local_b8,0x80);
      uVar8 = CONCAT44(uVar9,iVar3);
      pcVar6 = "%s: IGSC: (%s:%s():%d) Cannot initialize driver, status %d\n";
      uVar7 = 0x6a0;
      goto LAB_00115bf1;
    }
    p_Var4 = igsc_get_log_callback_func();
    pcVar5 = gsc_time(local_b8,0x80);
    uVar8 = CONCAT44(uVar9,iVar3);
    pcVar6 = "%s: IGSC: (%s:%s():%d) Cannot initialize driver, status %d\n";
    uVar7 = 0x6a0;
  }
  else {
    p_Var4 = igsc_get_log_callback_func();
    if (p_Var4 == (igsc_log_func_t)0x0) {
      pcVar5 = gsc_time(local_b8,0x80);
      uVar8 = CONCAT44(uVar9,flags);
      pcVar6 = "%s: IGSC: (%s:%s():%d) Wrong flags value 0x%x\n";
      iVar3 = 3;
      uVar7 = 0x697;
      goto LAB_00115bf1;
    }
    p_Var4 = igsc_get_log_callback_func();
    pcVar5 = gsc_time(local_b8,0x80);
    uVar8 = CONCAT44(uVar9,flags);
    pcVar6 = "%s: IGSC: (%s:%s():%d) Wrong flags value 0x%x\n";
    uVar7 = 0x697;
  }
  (*p_Var4)(IGSC_LOG_LEVEL_ERROR,pcVar6,pcVar5,
            "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
            "igsc_device_update_late_binding_config",uVar7,uVar8);
LAB_00115dfa:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

int igsc_device_update_late_binding_config(IN struct  igsc_device_handle *handle,
                                           IN uint32_t type, /* enum csc_late_binding_type */
                                           IN uint32_t flags,
                                           IN uint8_t *payload, IN size_t payload_size,
                                           OUT uint32_t *cmd_status) /* enum csc_late_binding_status */
{
    int status;
    size_t request_len;
    size_t response_len;
    size_t received_len = 0;
    size_t buf_len;
    struct igsc_lib_ctx *lib_ctx;

    struct csc_heci_late_binding_resp *resp;
    struct csc_heci_late_binding_req *req;

    if (!handle || !handle->ctx || cmd_status == NULL || payload == NULL || payload_size == 0)
    {
        return IGSC_ERROR_INVALID_PARAMETER;
    }

    lib_ctx = handle->ctx;

    if (type != CSC_LATE_BINDING_TYPE_FAN_TABLE && type != CSC_LATE_BINDING_TYPE_VR_CONFIG)
    {
        gsc_error("Wrong payload type %u\n", type);
        return IGSC_ERROR_INVALID_PARAMETER;
    }

    if ((flags & ~(uint32_t)CSC_LATE_BINDING_FLAGS_IS_PERSISTENT_MASK) != 0)
    {
        gsc_error("Wrong flags value 0x%x\n", flags);
        return IGSC_ERROR_INVALID_PARAMETER;
    }

    gsc_debug("in late binding, initializing driver\n");

    status = gsc_driver_init(lib_ctx, &GUID_METEE_MKHI);
    if (status != IGSC_SUCCESS)
    {
        gsc_error("Cannot initialize driver, status %d\n", status);
        return status;
    }

    req = (struct csc_heci_late_binding_req *)lib_ctx->working_buffer;
    buf_len = lib_ctx->working_buffer_length;
    if (payload_size > buf_len - sizeof(*req))
    {
        gsc_error("Payload size is too big %zu\n", payload_size);
        status = IGSC_ERROR_INVALID_PARAMETER;
        goto exit;
    }

    request_len = sizeof(*req) + payload_size;
    resp = (struct csc_heci_late_binding_resp *)lib_ctx->working_buffer;
    response_len = sizeof(*resp);

    status = gsc_fwu_buffer_validate(lib_ctx, request_len, response_len);
    if (status != IGSC_SUCCESS)
    {
        goto exit;
    }

    memset(req, 0, request_len);
    req->header.command = GFX_SRV_MKHI_LATE_BINDING_CMD;
    req->header.group_id = MKHI_GROUP_ID_GFX_SRV;
    req->type = type;
    req->flags = flags;
    req->payload_size = (uint32_t)payload_size;
    if (gsc_memcpy_s(req->payload, buf_len - sizeof(*req), payload, payload_size))
    {
        gsc_error("Copy of payload data failed\n");
        status = IGSC_ERROR_INTERNAL;
        goto exit;
    }

    status = gsc_tee_command(lib_ctx, req, request_len, resp, buf_len, &received_len);
    if (status != IGSC_SUCCESS)
    {
        gsc_error("Invalid HECI message response (%d)\n", status);
        goto exit;
    }

    if (received_len < sizeof(*resp))
    {
        gsc_error("Error in HECI read - bad size %zu\n", received_len);
        status = IGSC_ERROR_PROTOCOL;
        goto exit;
    }

    status = mkhi_heci_validate_response_header(lib_ctx, &resp->header,
                                                GFX_SRV_MKHI_LATE_BINDING_CMD);
    if (status != IGSC_SUCCESS)
    {
        gsc_error("Invalid HECI message response (%d)\n", status);
        goto exit;
    }

    if (received_len != response_len)
    {
        gsc_error("Error in HECI read - bad size %zu\n", received_len);
        status = IGSC_ERROR_PROTOCOL;
        goto exit;
    }

    if (resp->type != type)
    {
        gsc_error("Received wrong payload type in response from firmware %u, expected %u\n",
                  resp->type, type);
        status = IGSC_ERROR_PROTOCOL;
        goto exit;
    }

    if (resp->reserved[0] != 0 || resp->reserved[1] != 0 )
    {
        gsc_error("HECI message response is leaking data\n");
        status = IGSC_ERROR_PROTOCOL;
        goto exit;
    }

    gsc_debug("success, status %u\n", resp->status);

    *cmd_status = resp->status;
    status = IGSC_SUCCESS;

exit:
    gsc_driver_deinit(lib_ctx);

    return status;

}